

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spm.cpp
# Opt level: O0

int __thiscall pg::SPMSolver::pm_cycles(SPMSolver *this,int *a,int pl)

{
  int iVar1;
  int local_2c;
  int local_28;
  int i;
  int m;
  int pl_local;
  int *a_local;
  SPMSolver *this_local;
  
  iVar1 = (int)this->k;
  local_28 = iVar1 + -1;
  if ((this->k & 1U) == (long)pl) {
    local_28 = iVar1 + -2;
  }
  local_2c = local_28;
  while( true ) {
    if (local_2c < 0) {
      return -1;
    }
    if (this->counts[local_2c] < a[local_2c]) break;
    local_2c = local_2c + -2;
  }
  return local_2c;
}

Assistant:

int
SPMSolver::pm_cycles(int *a, int pl)
{
    int m = k-1;
    if ((k&1)==pl) m--;
    for (int i=m; i>=0; i-=2) {
        if (a[i] > counts[i]) return i;
    }
    return -1;
}